

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void icetMatrixMultiplyScale(IceTDouble *mat_out,IceTDouble x,IceTDouble y,IceTDouble z)

{
  IceTDouble local_a8;
  IceTDouble transform [16];
  IceTDouble z_local;
  IceTDouble y_local;
  IceTDouble x_local;
  IceTDouble *mat_out_local;
  
  transform[0xf] = z;
  icetMatrixScale(x,y,z,&local_a8);
  icetMatrixPostMultiply(mat_out,&local_a8);
  return;
}

Assistant:

void icetMatrixMultiplyScale(IceTDouble *mat_out,
                             IceTDouble x,
                             IceTDouble y,
                             IceTDouble z)
{
    IceTDouble transform[16];
    icetMatrixScale(x, y, z, transform);
    icetMatrixPostMultiply(mat_out, (const IceTDouble *)transform);
}